

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::TreeMap<kj::String,_int>::Entry>::setCapacity
          (Vector<kj::TreeMap<kj::String,_int>::Entry> *this,size_t newSize)

{
  __off_t in_RDX;
  ArrayBuilder<kj::StringPtr> newBuilder;
  ArrayBuilder<kj::StringPtr> local_30;
  
  if (newSize < (ulong)(*(long *)(this + 8) - *(long *)this >> 5)) {
    ArrayBuilder<kj::TreeMap<kj::String,_int>::Entry>::truncate
              ((ArrayBuilder<kj::TreeMap<kj::String,_int>::Entry> *)this,(char *)newSize,in_RDX);
  }
  local_30.ptr = _::HeapArrayDisposer::allocateUninitialized<kj::TreeMap<kj::String,int>::Entry>
                           (newSize);
  local_30.endPtr = local_30.ptr + newSize * 2;
  local_30.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<kj::TreeMap<kj::String,int>::Entry>::
  addAll<kj::ArrayBuilder<kj::TreeMap<kj::String,int>::Entry>>
            ((ArrayBuilder<kj::TreeMap<kj::String,int>::Entry> *)&local_30,
             (ArrayBuilder<kj::StringPtr> *)this);
  ArrayBuilder<kj::TreeMap<kj::String,_int>::Entry>::operator=
            ((ArrayBuilder<kj::TreeMap<kj::String,_int>::Entry> *)this,&local_30);
  ArrayBuilder<kj::TreeMap<kj::String,_int>::Entry>::dispose
            ((ArrayBuilder<kj::TreeMap<kj::String,_int>::Entry> *)&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }